

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O3

void * de::cmdline::detail::findNamedValueMatch
                 (char *src,void *namedValues,void *namedValuesEnd,size_t stride)

{
  int iVar1;
  invalid_argument *this;
  long *plVar2;
  long *plVar3;
  void *curValue;
  string srcStr;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,src,(allocator<char> *)&local_88);
  if (namedValues != namedValuesEnd) {
    do {
      iVar1 = std::__cxx11::string::compare((char *)&local_68);
      if (iVar1 == 0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        return namedValues;
      }
      namedValues = (void *)((long)namedValues + stride);
    } while (namedValues != namedValuesEnd);
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_48,"unrecognized value \'",&local_68);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_88 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_88 == plVar3) {
    local_78 = *plVar3;
    lStack_70 = plVar2[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar3;
  }
  local_80 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::invalid_argument::invalid_argument(this,(string *)&local_88);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

const void* findNamedValueMatch (const char* src, const void* namedValues, const void* namedValuesEnd, size_t stride)
{
	std::string srcStr(src);

	for (const void* curValue = namedValues; curValue != namedValuesEnd; curValue = (const void*)((deUintptr)curValue + stride))
	{
		if (srcStr == getNamedValueName(curValue))
			return curValue;
	}

	throw std::invalid_argument("unrecognized value '" + srcStr + "'");
}